

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O1

SpatialMatrix *
RigidBodyDynamics::Math::XtransRotZYXEuler
          (SpatialMatrix *__return_storage_ptr__,Vector3d *displacement,Vector3d *zyx_euler)

{
  double dVar1;
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  double *local_4d8;
  double *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  double local_498;
  double local_490;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined8 local_478;
  double local_470;
  undefined8 local_468;
  double local_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  double local_440;
  double local_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  double local_360;
  double local_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined4 local_330;
  undefined4 uStack_32c;
  double local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  double local_2b8;
  double local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined4 local_288;
  undefined4 uStack_284;
  double local_280;
  double local_278 [2];
  undefined4 local_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  double local_218;
  undefined8 local_210;
  double local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  double local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  double local_170;
  undefined8 local_168;
  double local_160;
  double local_158;
  double local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined4 uStack_124;
  double local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  double local_b0;
  double local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined4 local_80;
  undefined4 uStack_7c;
  double local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  dVar1 = sin((zyx_euler->super_Vector3d).
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
             );
  local_158 = cos((zyx_euler->super_Vector3d).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[0]);
  local_4e8 = SUB84(dVar1,0);
  uStack_4e4 = (undefined4)((ulong)dVar1 >> 0x20);
  local_128 = local_4e8;
  uStack_124 = uStack_4e4;
  local_150 = -dVar1;
  local_f8 = 0;
  uStack_f0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_90 = 0;
  uStack_88 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_e8 = 0x3ff0000000000000;
  uStack_e0 = 0;
  local_80 = local_4e8;
  uStack_7c = uStack_4e4;
  local_a8 = -dVar1;
  local_50 = 0;
  uStack_48 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_a0 = 0;
  uStack_98 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_40 = 0x3ff0000000000000;
  local_120 = local_158;
  local_b0 = local_158;
  local_78 = local_158;
  dVar1 = sin((zyx_euler->super_Vector3d).
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
             );
  local_278[0] = cos((zyx_euler->super_Vector3d).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[1]);
  local_4e8 = SUB84(dVar1,0);
  uStack_4e4 = (undefined4)((ulong)dVar1 >> 0x20);
  local_218 = -dVar1;
  local_278[1] = 0.0;
  local_210 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_268 = local_4e8;
  uStack_264 = uStack_4e4;
  local_240 = 0x3ff0000000000000;
  uStack_238 = 0;
  local_1e0 = 0;
  uStack_1d8 = 0;
  local_178 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_170 = -dVar1;
  local_260 = 0;
  uStack_258 = 0;
  local_230 = 0;
  uStack_228 = 0;
  local_200 = 0;
  uStack_1f8 = 0;
  local_1c8 = 0;
  local_168 = 0;
  local_250 = 0;
  uStack_248 = 0;
  local_220 = 0;
  local_1f0 = 0;
  uStack_1e8 = 0;
  local_1c0 = local_4e8;
  uStack_1bc = uStack_4e4;
  local_198 = 0x3ff0000000000000;
  uStack_190 = 0;
  local_208 = local_278[0];
  local_1d0 = local_278[0];
  local_160 = local_278[0];
  dVar1 = sin((zyx_euler->super_Vector3d).
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
             );
  local_360 = cos((zyx_euler->super_Vector3d).
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                  array[2]);
  local_4e8 = SUB84(dVar1,0);
  uStack_4e4 = (undefined4)((ulong)dVar1 >> 0x20);
  local_4c8 = &local_398;
  local_368 = 0;
  local_398 = 0x3ff0000000000000;
  uStack_390 = 0;
  local_330 = local_4e8;
  uStack_32c = uStack_4e4;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_358 = -dVar1;
  local_300 = 0;
  uStack_2f8 = 0;
  local_2d0 = 0;
  uStack_2c8 = 0;
  local_388 = 0;
  uStack_380 = 0;
  local_2c0 = 0;
  local_298 = 0;
  uStack_290 = 0;
  local_350 = 0;
  uStack_348 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_2f0 = 0x3ff0000000000000;
  uStack_2e8 = 0;
  local_288 = local_4e8;
  uStack_284 = uStack_4e4;
  local_378 = 0;
  uStack_370 = 0;
  local_340 = 0;
  uStack_338 = 0;
  local_310 = 0;
  uStack_308 = 0;
  local_2e0 = 0;
  uStack_2d8 = 0;
  local_2b0 = -dVar1;
  local_438 = (displacement->super_Vector3d).
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
  ;
  local_490 = (displacement->super_Vector3d).
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
  ;
  local_470 = (displacement->super_Vector3d).
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
  ;
  local_4c0 = &local_4b8;
  local_4b8 = 0x3ff0000000000000;
  uStack_4b0 = 0;
  local_488 = 0;
  uStack_484 = 0;
  uStack_480 = 0;
  uStack_47c = 0x3ff00000;
  local_458 = 0;
  uStack_450 = 0;
  local_478 = 0;
  local_448 = 0x3ff0000000000000;
  local_420 = 0;
  uStack_418 = 0;
  local_3f0 = 0;
  uStack_3e8 = 0;
  local_3c0 = 0;
  uStack_3b8 = 0;
  local_4a8 = 0;
  uStack_4a0 = 0;
  local_440 = -local_490;
  local_498 = -local_470;
  local_468 = 0;
  local_410 = 0x3ff0000000000000;
  uStack_408 = 0;
  local_3e0 = 0;
  uStack_3dc = 0;
  uStack_3d8 = 0;
  uStack_3d4 = 0x3ff00000;
  local_3b0 = 0;
  uStack_3a8 = 0;
  local_460 = -local_438;
  local_430 = 0;
  uStack_428 = 0;
  local_400 = 0;
  uStack_3f8 = 0;
  local_3d0 = 0;
  uStack_3c8 = 0;
  local_3a0 = 0x3ff0000000000000;
  local_4d8 = &local_158;
  local_4d0 = local_278;
  local_328 = local_360;
  local_2b8 = local_360;
  local_280 = local_360;
  SpatialMatrix_t::
  SpatialMatrix_t<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,6,0,6,6>,0>,Eigen::Matrix<double,6,6,0,6,6>,0>,Eigen::Matrix<double,6,6,0,6,6>,0>>
            (__return_storage_ptr__,
             (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>_>
              *)&local_4d8);
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI
SpatialMatrix XtransRotZYXEuler (const Vector3d &displacement, const Vector3d &zyx_euler) {
	return Xrotz_mat(zyx_euler[0]) * Xroty_mat(zyx_euler[1]) * Xrotx_mat(zyx_euler[2]) * Xtrans_mat(displacement);
}